

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdn_test.cc
# Opt level: O0

int main(void)

{
  test_add_cdn_domain();
  test_delete_cdn_domain();
  test_describe_cdn_domain_base_detail();
  test_describe_cdn_domain_detail();
  test_describe_cdn_domain_logs();
  test_describe_cdn_monitor_data();
  test_describe_cdn_service();
  test_describe_one_minute_data();
  test_describe_refresh_tasks();
  test_describe_user_domains();
  test_modify_cdn_service();
  test_open_cdn_service();
  test_push_object_cache();
  test_refresh_object_caches();
  test_start_cdn_domain();
  test_stop_cdn_domain();
  return 0;
}

Assistant:

int main() {
  test_add_cdn_domain();
  test_delete_cdn_domain();
  test_describe_cdn_domain_base_detail();
  test_describe_cdn_domain_detail();
  test_describe_cdn_domain_logs();
  test_describe_cdn_monitor_data();
  test_describe_cdn_service();
  test_describe_one_minute_data();
  test_describe_refresh_tasks();
  test_describe_user_domains();
  test_modify_cdn_service();
  test_open_cdn_service();
  test_push_object_cache();
  test_refresh_object_caches();
  test_start_cdn_domain();
  test_stop_cdn_domain();
}